

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int execute_filter_e8(rar_filter *filter,rar_virtual_machine *vm,size_t pos,int e9also)

{
  uint uVar1;
  byte bVar2;
  uint32_t uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  uVar3 = filter->initialregisters[4];
  iVar7 = 0;
  if (0xfffc4003 < uVar3 - 0x3c001) {
    uVar5 = 0;
    do {
      if ((vm->memory[uVar5] == 0xe8) || (e9also != 0 && vm->memory[uVar5] == 0xe9)) {
        uVar1 = (int)pos + 1 + uVar5;
        bVar2 = vm->memory[(long)(int)uVar5 + 4];
        bVar4 = vm->memory[(long)(int)uVar5 + 3];
        uVar6 = (uint)bVar4 << 0x10 | (uint)vm->memory[(long)(int)uVar5 + 1] |
                (uint)vm->memory[(long)(int)uVar5 + 2] << 8 | (uint)bVar2 << 0x18;
        if (((int)((uint)bVar2 << 0x18) < 0) && (-uVar6 <= uVar1)) {
          iVar7 = uVar6 + 0x1000000;
          vm->memory[(long)(int)uVar5 + 1] = vm->memory[(long)(int)uVar5 + 1];
          vm->memory[(long)(int)uVar5 + 2] = vm->memory[(long)(int)uVar5 + 2];
LAB_0024ae15:
          vm->memory[(long)(int)uVar5 + 3] = bVar4;
          vm->memory[(long)(int)uVar5 + 4] = (uint8_t)((uint)iVar7 >> 0x18);
        }
        else if (bVar2 == 0) {
          iVar7 = uVar6 - uVar1;
          *(short *)(vm->memory + (long)(int)uVar5 + 1) = (short)iVar7;
          bVar4 = (byte)((uint)iVar7 >> 0x10);
          goto LAB_0024ae15;
        }
        uVar5 = uVar5 + 4;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 <= uVar3 - 5);
    filter->filteredblockaddress = 0;
    filter->filteredblocklength = uVar3;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int
execute_filter_e8(struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos, int e9also)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t filesize = 0x1000000;
  uint32_t i;

  if (length > PROGRAM_WORK_SIZE || length <= 4)
    return 0;

  for (i = 0; i <= length - 5; i++)
  {
    if (vm->memory[i] == 0xE8 || (e9also && vm->memory[i] == 0xE9))
    {
      uint32_t currpos = (uint32_t)pos + i + 1;
      int32_t address = (int32_t)vm_read_32(vm, i + 1);
      if (address < 0 && currpos >= (~(uint32_t)address + 1))
        vm_write_32(vm, i + 1, address + filesize);
      else if (address >= 0 && (uint32_t)address < filesize)
        vm_write_32(vm, i + 1, address - currpos);
      i += 4;
    }
  }

  filter->filteredblockaddress = 0;
  filter->filteredblocklength = length;

  return 1;
}